

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O1

Class object_getClass(id obj)

{
  Class poVar1;
  
  if (obj == (id)0x0) {
    poVar1 = (Class)0x0;
  }
  else {
    if (((ulong)obj & 7) != 0) {
      obj = (id)((long)SmallObjectClasses + (ulong)(uint)((int)((ulong)obj & 7) << 3));
    }
    for (poVar1 = obj->isa; (poVar1 != (Class)0x0 && ((poVar1->info & 0x1000) != 0));
        poVar1 = poVar1->super_class) {
    }
  }
  return poVar1;
}

Assistant:

Class object_getClass(id obj)
{
	CHECK_ARG(obj);
	Class isa = classForObject(obj);
	while ((Nil != isa) && objc_test_class_flag(isa, objc_class_flag_hidden_class))
	{
		isa = isa->super_class;
	}
	return isa;
}